

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTVector3::normalize(RTVector3 *this)

{
  float fVar1;
  double dVar2;
  RTFLOAT length;
  RTVector3 *this_local;
  
  dVar2 = std::sqrt((double)(ulong)(uint)(this->m_data[2] * this->m_data[2] +
                                         this->m_data[0] * this->m_data[0] +
                                         this->m_data[1] * this->m_data[1]));
  fVar1 = SUB84(dVar2,0);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->m_data[0] = this->m_data[0] / fVar1;
    this->m_data[1] = this->m_data[1] / fVar1;
    this->m_data[2] = this->m_data[2] / fVar1;
  }
  return;
}

Assistant:

void RTVector3::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2]);

    if (length == 0)
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
}